

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_file_hash_dictionary_handler.c
# Opt level: O0

ion_err_t oafdict_destroy_dictionary(ion_dictionary_id_t id)

{
  int iVar1;
  char local_1c [4];
  int actual_filename_length;
  char addr_filename [12];
  ion_dictionary_id_t id_local;
  
  addr_filename._4_4_ = id;
  iVar1 = dictionary_get_filename(id,"oaf",local_1c);
  if (iVar1 < 0xc) {
    remove(local_1c);
    addr_filename[0xb] = '\0';
  }
  else {
    addr_filename[0xb] = '\x04';
  }
  return addr_filename[0xb];
}

Assistant:

ion_err_t
oafdict_destroy_dictionary(
	ion_dictionary_id_t id
) {
	char addr_filename[ION_MAX_FILENAME_LENGTH];

	int actual_filename_length = dictionary_get_filename(id, "oaf", addr_filename);

	if (actual_filename_length >= ION_MAX_FILENAME_LENGTH) {
		return err_dictionary_destruction_error;
	}

	fremove(addr_filename);

	return err_ok;
}